

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::is_finished(torrent *this)

{
  bool bVar1;
  pointer this_00;
  bool local_21;
  torrent *this_local;
  
  bVar1 = is_seed(this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = valid_metadata(this);
    local_21 = false;
    if (bVar1) {
      bVar1 = has_picker(this);
      local_21 = false;
      if (bVar1) {
        this_00 = ::std::
                  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                  ::operator->(&(this->super_torrent_hot_members).m_picker);
        local_21 = piece_picker::is_finished(this_00);
      }
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool torrent::is_finished() const
	{
		if (is_seed()) return true;
		return valid_metadata() && has_picker() && m_picker->is_finished();
	}